

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adiosYAML.cpp
# Opt level: O2

void adios2::helper::ParseHostOptionsFile
               (Comm *comm,string *configFileYAML,HostOptions *hosts,string *homePath)

{
  bool bVar1;
  string *psVar2;
  undefined1 mandatory;
  undefined8 uVar3;
  allocator local_6d3;
  allocator local_6d2;
  allocator local_6d1;
  string hint;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_6b0;
  string authStr;
  iterator itHost;
  const_iterator itDoc;
  string hostname;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_5f0;
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::vector<adios2::HostConfig,std::allocator<adios2::HostConfig>>>,std::_Select1st<std::pair<std::__cxx11::string_const,std::vector<adios2::HostConfig,std::allocator<adios2::HostConfig>>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::vector<adios2::HostConfig,std::allocator<adios2::HostConfig>>>>>
  *local_5d0;
  Node *local_5c8;
  HostConfig hc;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4e8;
  vector<adios2::HostConfig,_std::allocator<adios2::HostConfig>_> hostConfigs;
  Node hostentry;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_470;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_450;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_430;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_410;
  string local_3f0;
  string configFileContents;
  Node document;
  string protocolStr;
  Node local_330;
  Node NStack_2f0;
  string local_2b0;
  string local_290;
  string local_270;
  string local_250;
  string local_230;
  string local_210;
  string local_1f0;
  string local_1d0;
  string local_1b0;
  string local_190;
  string local_170;
  string local_150;
  string local_130;
  string local_110;
  string local_f0;
  string local_d0;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  local_5d0 = (_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::vector<adios2::HostConfig,std::allocator<adios2::HostConfig>>>,std::_Select1st<std::pair<std::__cxx11::string_const,std::vector<adios2::HostConfig,std::allocator<adios2::HostConfig>>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::vector<adios2::HostConfig,std::allocator<adios2::HostConfig>>>>>
               *)hosts;
  std::operator+(&hc.name,"when parsing host config file ",configFileYAML);
  std::operator+(&hint,&hc.name," in call to ADIOS constructor");
  std::__cxx11::string::~string((string *)&hc);
  std::__cxx11::string::string((string *)&local_3f0,(string *)&hint);
  uVar3 = 0;
  Comm::BroadcastFile(&configFileContents,comm,configFileYAML,&local_3f0,0);
  std::__cxx11::string::~string((string *)&local_3f0);
  YAML::Load(&document,&configFileContents);
  bVar1 = YAML::Node::operator!(&document);
  if (bVar1) {
    std::__cxx11::string::string((string *)&hc,"Helper",(allocator *)&authStr);
    std::__cxx11::string::string((string *)&protocolStr,"adiosHostOptions",(allocator *)&local_6b0);
    std::__cxx11::string::string
              ((string *)&hostentry,"ParseHostOptionsFile",(allocator *)&local_5f0);
    std::operator+(&hostname,"parser error in file ",configFileYAML);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&itHost,
                   &hostname,
                   ": invalid format. Check with any YAML editor if format is ill-formed, ");
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&itDoc,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&itHost,
                   &hint);
    uVar3 = 0xffffffffffffffff;
    Throw<std::invalid_argument>(&hc.name,&protocolStr,(string *)&hostentry,(string *)&itDoc,-1);
    std::__cxx11::string::~string((string *)&itDoc);
    std::__cxx11::string::~string((string *)&itHost);
    std::__cxx11::string::~string((string *)&hostname);
    std::__cxx11::string::~string((string *)&hostentry);
    std::__cxx11::string::~string((string *)&protocolStr);
    std::__cxx11::string::~string((string *)&hc);
  }
  bVar1 = YAML::Node::IsMap(&document);
  if (!bVar1) {
    std::__cxx11::string::string((string *)&hc,"Helper",(allocator *)&itHost);
    std::__cxx11::string::string((string *)&protocolStr,"adiosHostOptions",(allocator *)&hostname);
    std::__cxx11::string::string((string *)&hostentry,"ParseHostOptionsFile",(allocator *)&authStr);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&itDoc,
                   "parser error: not a YAML Map of hosts, ",&hint);
    uVar3 = 0xffffffffffffffff;
    Throw<std::invalid_argument>(&hc.name,&protocolStr,(string *)&hostentry,(string *)&itDoc,-1);
    std::__cxx11::string::~string((string *)&itDoc);
    std::__cxx11::string::~string((string *)&hostentry);
    std::__cxx11::string::~string((string *)&protocolStr);
    std::__cxx11::string::~string((string *)&hc);
  }
  YAML::Node::begin(&itDoc,&document);
  local_5c8 = (Node *)((long)&hc.remoteServerPath.field_2 + 8);
  do {
    YAML::Node::end((const_iterator *)&hc,&document);
    bVar1 = YAML::detail::node_iterator_base<YAML::detail::node>::operator!=
                      (&itDoc.m_iterator,(node_iterator_base<YAML::detail::node> *)&hc);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&hc.hostname);
    if (!bVar1) {
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&itDoc.m_pMemory.
                  super___shared_ptr<YAML::detail::memory_holder,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount);
      YAML::Node::~Node(&document);
      std::__cxx11::string::~string((string *)&configFileContents);
      std::__cxx11::string::~string((string *)&hint);
      return;
    }
    YAML::detail::iterator_base<const_YAML::detail::iterator_value>::operator->((proxy *)&hc,&itDoc)
    ;
    YAML::Node::as<std::__cxx11::string>(&hostname,(Node *)((long)&hc.hostname.field_2 + 8));
    YAML::detail::iterator_value::~iterator_value((iterator_value *)&hc);
    YAML::detail::iterator_base<const_YAML::detail::iterator_value>::operator->((proxy *)&hc,&itDoc)
    ;
    YAML::Node::Node(&hostentry,local_5c8);
    YAML::detail::iterator_value::~iterator_value((iterator_value *)&hc);
    bVar1 = YAML::Node::IsMap(&hostentry);
    if (!bVar1) {
      std::__cxx11::string::string((string *)&hc,"Helper",(allocator *)&local_470);
      std::__cxx11::string::string
                ((string *)&protocolStr,"adiosHostOptions",(allocator *)&local_4e8);
      std::__cxx11::string::string((string *)&itHost,"ParseHostOptionsFile",(allocator *)&local_450)
      ;
      std::operator+(&local_5f0,"parser error for host ",&hostname);
      std::operator+(&local_6b0,&local_5f0,": each host must have a YAML Map of options, ");
      std::operator+(&authStr,&local_6b0,&hint);
      uVar3 = 0xffffffffffffffff;
      Throw<std::invalid_argument>(&hc.name,&protocolStr,(string *)&itHost,&authStr,-1);
      std::__cxx11::string::~string((string *)&authStr);
      std::__cxx11::string::~string((string *)&local_6b0);
      std::__cxx11::string::~string((string *)&local_5f0);
      std::__cxx11::string::~string((string *)&itHost);
      std::__cxx11::string::~string((string *)&protocolStr);
      std::__cxx11::string::~string((string *)&hc);
    }
    hostConfigs.super__Vector_base<adios2::HostConfig,_std::allocator<adios2::HostConfig>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    hostConfigs.super__Vector_base<adios2::HostConfig,_std::allocator<adios2::HostConfig>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    hostConfigs.super__Vector_base<adios2::HostConfig,_std::allocator<adios2::HostConfig>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    YAML::Node::begin(&itHost,&hostentry);
    while( true ) {
      YAML::Node::end((iterator *)&hc,&hostentry);
      bVar1 = YAML::detail::node_iterator_base<YAML::detail::node>::operator!=
                        (&itHost.m_iterator,(node_iterator_base<YAML::detail::node> *)&hc);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&hc.hostname);
      mandatory = (undefined1)uVar3;
      if (!bVar1) break;
      HostConfig::HostConfig(&hc);
      YAML::detail::iterator_base<YAML::detail::iterator_value>::operator->
                ((proxy *)&protocolStr,&itHost);
      YAML::Node::as<std::__cxx11::string>(&authStr,&local_330);
      std::__cxx11::string::operator=((string *)&hc,(string *)&authStr);
      std::__cxx11::string::~string((string *)&authStr);
      YAML::detail::iterator_value::~iterator_value((iterator_value *)&protocolStr);
      YAML::detail::iterator_base<YAML::detail::iterator_value>::operator->
                ((proxy *)&protocolStr,&itHost);
      YAML::detail::iterator_value::~iterator_value((iterator_value *)&protocolStr);
      bVar1 = YAML::Node::IsMap(&NStack_2f0);
      if (!bVar1) {
        std::__cxx11::string::string((string *)&protocolStr,"Helper",(allocator *)&local_450);
        std::__cxx11::string::string((string *)&authStr,"adiosHostOptions",(allocator *)&local_410);
        std::__cxx11::string::string
                  ((string *)&local_6b0,"ParseHostOptionsFile",(allocator *)&local_430);
        std::operator+(&local_4e8,"parser error for host ",&hostname);
        std::operator+(&local_470,&local_4e8,": each entry in the list must be a YAML Map, ");
        std::operator+(&local_5f0,&local_470,&hint);
        mandatory = 0xff;
        Throw<std::invalid_argument>(&protocolStr,&authStr,&local_6b0,&local_5f0,-1);
        std::__cxx11::string::~string((string *)&local_5f0);
        std::__cxx11::string::~string((string *)&local_470);
        std::__cxx11::string::~string((string *)&local_4e8);
        std::__cxx11::string::~string((string *)&local_6b0);
        std::__cxx11::string::~string((string *)&authStr);
        std::__cxx11::string::~string((string *)&protocolStr);
      }
      std::__cxx11::string::string((string *)&local_90,"verbose",(allocator *)&protocolStr);
      anon_unknown_0::SetOption<int>(&hc.verbose,&local_90,&NStack_2f0,&hint,(bool)mandatory);
      std::__cxx11::string::~string((string *)&local_90);
      protocolStr._M_dataplus._M_p = (pointer)&protocolStr.field_2;
      protocolStr._M_string_length = 0;
      protocolStr.field_2._M_local_buf[0] = '\0';
      std::__cxx11::string::string((string *)&local_b0,"protocol",(allocator *)&authStr);
      (anonymous_namespace)::SetOption<std::__cxx11::string>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&protocolStr,
                 &local_b0,&NStack_2f0,&hint,true);
      std::__cxx11::string::~string((string *)&local_b0);
      std::__cxx11::string::string((string *)&local_d0,(string *)&protocolStr);
      hc.protocol = GetHostAccessProtocol(&local_d0);
      std::__cxx11::string::~string((string *)&local_d0);
      if (hc.protocol == SSH) {
        authStr._M_dataplus._M_p = (pointer)&authStr.field_2;
        authStr._M_string_length = 0;
        authStr.field_2._M_local_buf[0] = '\0';
        std::__cxx11::string::string((string *)&local_f0,"authentication",(allocator *)&local_6b0);
        (anonymous_namespace)::SetOption<std::__cxx11::string>
                  (&authStr,&local_f0,&NStack_2f0,&hint,true);
        std::__cxx11::string::~string((string *)&local_f0);
        std::__cxx11::string::string((string *)&local_50,(string *)&authStr);
        hc.authentication = GetHostAuthProtocol(&local_50);
        std::__cxx11::string::~string((string *)&local_50);
        std::__cxx11::string::string((string *)&local_110,"host",(allocator *)&local_6b0);
        (anonymous_namespace)::SetOption<std::__cxx11::string>
                  (&hc.hostname,&local_110,&NStack_2f0,&hint,true);
        std::__cxx11::string::~string((string *)&local_110);
        std::__cxx11::string::string((string *)&local_130,"user",(allocator *)&local_6b0);
        (anonymous_namespace)::SetOption<std::__cxx11::string>
                  (&hc.username,&local_130,&NStack_2f0,&hint,false);
        std::__cxx11::string::~string((string *)&local_130);
        std::__cxx11::string::string((string *)&local_150,"serverpath",(allocator *)&local_6b0);
        uVar3 = 1;
        (anonymous_namespace)::SetOption<std::__cxx11::string>
                  (&hc.remoteServerPath,&local_150,&NStack_2f0,&hint,true);
        std::__cxx11::string::~string((string *)&local_150);
        std::__cxx11::string::string((string *)&local_170,"port",(allocator *)&local_6b0);
        anon_unknown_0::SetOption<unsigned_short>
                  (&hc.port,&local_170,&NStack_2f0,&hint,SUB81(uVar3,0));
        std::__cxx11::string::~string((string *)&local_170);
        psVar2 = &local_190;
        std::__cxx11::string::string((string *)psVar2,"local_port",(allocator *)&local_6b0);
        anon_unknown_0::SetOption<unsigned_short>
                  (&hc.localPort,psVar2,&NStack_2f0,&hint,SUB81(uVar3,0));
LAB_0047e148:
        std::__cxx11::string::~string((string *)psVar2);
        psVar2 = &authStr;
      }
      else {
        if (hc.protocol == XRootD) {
          authStr._M_dataplus._M_p = (pointer)&authStr.field_2;
          authStr._M_string_length = 0;
          authStr.field_2._M_local_buf[0] = '\0';
          std::__cxx11::string::string
                    ((string *)&local_1b0,"authentication",(allocator *)&local_6b0);
          (anonymous_namespace)::SetOption<std::__cxx11::string>
                    (&authStr,&local_1b0,&NStack_2f0,&hint,true);
          std::__cxx11::string::~string((string *)&local_1b0);
          std::__cxx11::string::string((string *)&local_70,(string *)&authStr);
          hc.authentication = GetHostAuthProtocol(&local_70);
          std::__cxx11::string::~string((string *)&local_70);
          std::__cxx11::string::string((string *)&local_1d0,"host",(allocator *)&local_6b0);
          (anonymous_namespace)::SetOption<std::__cxx11::string>
                    (&hc.hostname,&local_1d0,&NStack_2f0,&hint,true);
          std::__cxx11::string::~string((string *)&local_1d0);
          std::__cxx11::string::string((string *)&local_1f0,"user",(allocator *)&local_6b0);
          (anonymous_namespace)::SetOption<std::__cxx11::string>
                    (&hc.username,&local_1f0,&NStack_2f0,&hint,false);
          std::__cxx11::string::~string((string *)&local_1f0);
          std::__cxx11::string::string((string *)&local_210,"serverpath",(allocator *)&local_6b0);
          uVar3 = 0;
          (anonymous_namespace)::SetOption<std::__cxx11::string>
                    (&hc.remoteServerPath,&local_210,&NStack_2f0,&hint,false);
          std::__cxx11::string::~string((string *)&local_210);
          psVar2 = &local_230;
          std::__cxx11::string::string((string *)psVar2,"port",(allocator *)&local_6b0);
          anon_unknown_0::SetOption<unsigned_short>
                    (&hc.port,psVar2,&NStack_2f0,&hint,SUB81(uVar3,0));
          goto LAB_0047e148;
        }
        if (hc.protocol != S3) {
          std::__cxx11::string::string((string *)&authStr,"Helper",&local_6d1);
          std::__cxx11::string::string((string *)&local_6b0,"adiosHostOptions",&local_6d2);
          std::__cxx11::string::string((string *)&local_5f0,"ParseHostOptionsFile",&local_6d3);
          std::operator+(&local_430,"parser error: invalid access host protocol \'",
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &protocolStr);
          std::operator+(&local_410,&local_430," for ");
          std::operator+(&local_450,&local_410,&hc.name);
          std::operator+(&local_4e8,&local_450,"\', ");
          std::operator+(&local_470,&local_4e8,&hint);
          psVar2 = &local_6b0;
          uVar3 = 0xffffffffffffffff;
          Throw<std::invalid_argument>(&authStr,psVar2,&local_5f0,&local_470,-1);
          std::__cxx11::string::~string((string *)&local_470);
          std::__cxx11::string::~string((string *)&local_4e8);
          std::__cxx11::string::~string((string *)&local_450);
          std::__cxx11::string::~string((string *)&local_410);
          std::__cxx11::string::~string((string *)&local_430);
          std::__cxx11::string::~string((string *)&local_5f0);
          goto LAB_0047e148;
        }
        std::__cxx11::string::string((string *)&local_250,"profile",(allocator *)&authStr);
        (anonymous_namespace)::SetOption<std::__cxx11::string>
                  (&hc.awsProfile,&local_250,&NStack_2f0,&hint,false);
        std::__cxx11::string::~string((string *)&local_250);
        std::__cxx11::string::string((string *)&local_270,"endpoint",(allocator *)&authStr);
        uVar3 = 1;
        (anonymous_namespace)::SetOption<std::__cxx11::string>
                  (&hc.endpoint,&local_270,&NStack_2f0,&hint,true);
        std::__cxx11::string::~string((string *)&local_270);
        std::__cxx11::string::string((string *)&local_290,"aws_ec2_metadata",(allocator *)&authStr);
        anon_unknown_0::SetOption<bool>(&hc.isAWS_EC2,&local_290,&NStack_2f0,&hint,SUB81(uVar3,0));
        std::__cxx11::string::~string((string *)&local_290);
        std::__cxx11::string::string((string *)&local_2b0,"recheck_metadata",(allocator *)&authStr);
        anon_unknown_0::SetOption<bool>
                  (&hc.recheckMetadata,&local_2b0,&NStack_2f0,&hint,SUB81(uVar3,0));
        psVar2 = &local_2b0;
      }
      std::__cxx11::string::~string((string *)psVar2);
      std::vector<adios2::HostConfig,_std::allocator<adios2::HostConfig>_>::push_back
                (&hostConfigs,&hc);
      std::__cxx11::string::~string((string *)&protocolStr);
      HostConfig::~HostConfig(&hc);
      YAML::detail::node_iterator_base<YAML::detail::node>::operator++(&itHost.m_iterator);
    }
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&itHost.m_pMemory.
                super___shared_ptr<YAML::detail::memory_holder,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    std::
    _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::vector<adios2::HostConfig,std::allocator<adios2::HostConfig>>>,std::_Select1st<std::pair<std::__cxx11::string_const,std::vector<adios2::HostConfig,std::allocator<adios2::HostConfig>>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::vector<adios2::HostConfig,std::allocator<adios2::HostConfig>>>>>
    ::
    _M_emplace_unique<std::__cxx11::string&,std::vector<adios2::HostConfig,std::allocator<adios2::HostConfig>>&>
              (local_5d0,&hostname,&hostConfigs);
    std::vector<adios2::HostConfig,_std::allocator<adios2::HostConfig>_>::~vector(&hostConfigs);
    YAML::Node::~Node(&hostentry);
    std::__cxx11::string::~string((string *)&hostname);
    YAML::detail::node_iterator_base<YAML::detail::node>::operator++(&itDoc.m_iterator);
  } while( true );
}

Assistant:

void ParseHostOptionsFile(Comm &comm, const std::string &configFileYAML, HostOptions &hosts,
                          std::string &homePath)
{
    const std::string hint =
        "when parsing host config file " + configFileYAML + " in call to ADIOS constructor";

    const std::string configFileContents = comm.BroadcastFile(configFileYAML, hint);

    const YAML::Node document = YAML::Load(configFileContents);
    if (!document)
    {
        helper::Throw<std::invalid_argument>(
            "Helper", "adiosHostOptions", "ParseHostOptionsFile",
            "parser error in file " + configFileYAML +
                ": invalid format. Check with any YAML editor if format is ill-formed, " + hint);
    }

    if (!document.IsMap())
    {
        helper::Throw<std::invalid_argument>("Helper", "adiosHostOptions", "ParseHostOptionsFile",
                                             "parser error: not a YAML Map of hosts, " + hint);
    }

    /* top level is a dictionary of <hostname, dictionary of options> */
    for (auto itDoc = document.begin(); itDoc != document.end(); ++itDoc)
    {
        std::string hostname = itDoc->first.as<std::string>();

        /* a dictionary of host options, with each entry a dictionary */
        YAML::Node hostentry = itDoc->second;
        if (!hostentry.IsMap())
        {
            helper::Throw<std::invalid_argument>(
                "Helper", "adiosHostOptions", "ParseHostOptionsFile",
                "parser error for host " + hostname +
                    ": each host must have a YAML Map of options, " + hint);
        }

        std::vector<HostConfig> hostConfigs;
        for (auto itHost = hostentry.begin(); itHost != hostentry.end(); ++itHost)
        {
            /* one connection setup as a dictionary */
            HostConfig hc;
            hc.name = itHost->first.as<std::string>();
            const YAML::Node &hostmap = itHost->second;
            if (!hostmap.IsMap())
            {
                helper::Throw<std::invalid_argument>(
                    "Helper", "adiosHostOptions", "ParseHostOptionsFile",
                    "parser error for host " + hostname +
                        ": each entry in the list must be a YAML Map, " + hint);
            }

            SetOption(hc.verbose, "verbose", hostmap, hint);
            std::string protocolStr;
            SetOption(protocolStr, "protocol", hostmap, hint, isMandatory);
            hc.protocol = GetHostAccessProtocol(protocolStr);
            switch (hc.protocol)
            {
            case HostAccessProtocol::SSH: {
                std::string authStr;
                SetOption(authStr, "authentication", hostmap, hint, isMandatory);
                hc.authentication = GetHostAuthProtocol(authStr);
                SetOption(hc.hostname, "host", hostmap, hint, isMandatory);
                SetOption(hc.username, "user", hostmap, hint);
                SetOption(hc.remoteServerPath, "serverpath", hostmap, hint, isMandatory);
                SetOption(hc.port, "port", hostmap, hint);
                SetOption(hc.localPort, "local_port", hostmap, hint);
                break;
            }
            case HostAccessProtocol::XRootD: {
                std::string authStr;
                SetOption(authStr, "authentication", hostmap, hint, isMandatory);
                hc.authentication = GetHostAuthProtocol(authStr);
                SetOption(hc.hostname, "host", hostmap, hint, isMandatory);
                SetOption(hc.username, "user", hostmap, hint);
                SetOption(hc.remoteServerPath, "serverpath", hostmap, hint);
                SetOption(hc.port, "port", hostmap, hint);
                break;
            }
            case HostAccessProtocol::S3: {
                SetOption(hc.awsProfile, "profile", hostmap, hint);
                SetOption(hc.endpoint, "endpoint", hostmap, hint, isMandatory);
                SetOption(hc.isAWS_EC2, "aws_ec2_metadata", hostmap, hint);
                SetOption(hc.recheckMetadata, "recheck_metadata", hostmap, hint);
                break;
            }
            default:
                helper::Throw<std::invalid_argument>(
                    "Helper", "adiosHostOptions", "ParseHostOptionsFile",
                    "parser error: invalid access host protocol '" + protocolStr + " for " +
                        hc.name + "', " + hint);
            }

            hostConfigs.push_back(hc);
        }
        hosts.emplace(hostname, hostConfigs);
    }
}